

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O3

int __thiscall
glslang::TPpContext::eval
          (TPpContext *this,int token,int precedence,bool shortCircuit,int *res,bool *err,
          TPpToken *ppToken)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  code *pcVar3;
  pointer pptVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  _Base_ptr p_Var9;
  long lVar10;
  _Base_ptr p_Var11;
  TParseContextBase *pTVar12;
  EShMessages EVar13;
  _func_int **pp_Var14;
  bool bVar15;
  TSourceLoc loc;
  undefined4 local_48;
  undefined4 uStack_44;
  int iStack_40;
  int iStack_3c;
  undefined8 local_38;
  
  while( true ) {
    local_38 = *(undefined8 *)&(ppToken->loc).column;
    local_48 = *(undefined4 *)&(ppToken->loc).name;
    uStack_44 = *(undefined4 *)((long)&(ppToken->loc).name + 4);
    iStack_40 = (ppToken->loc).string;
    iStack_3c = (ppToken->loc).line;
    if (token == 0x28) goto LAB_004c9158;
    if (token == 0x98) {
      *res = (ppToken->field_3).ival;
      goto LAB_004c914c;
    }
    if (token != 0xa2) {
      uVar6 = 3;
      goto LAB_004c91b8;
    }
    iVar5 = strcmp("defined",ppToken->name);
    if (iVar5 == 0) break;
    iVar5 = tokenPaste(this,0xa2,ppToken);
    token = evalToToken(this,iVar5,shortCircuit,res,err,ppToken);
  }
  if (((((this->parseContext->super_TParseVersions).messages & EShMsgReadHlsl) == EShMsgDefault) &&
      (pptVar4 = (this->inputStack).
                 super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
      pptVar4 !=
      (this->inputStack).
      super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
      ._M_impl.super__Vector_impl_data._M_start)) &&
     (iVar5 = (*pptVar4[-1]->_vptr_tInput[8])(), (char)iVar5 != '\0')) {
    pTVar12 = this->parseContext;
    EVar13 = (pTVar12->super_TParseVersions).messages & EShMsgRelaxedErrors;
    pcVar8 = "nonportable when expanded from macros for preprocessor expression";
    if (EVar13 == EShMsgDefault) {
      pcVar8 = "cannot use in preprocessor expression when expanded from macros";
    }
    (*(pTVar12->super_TParseVersions)._vptr_TParseVersions[(ulong)EVar13 + 0x2f])
              (pTVar12,ppToken,pcVar8,"defined","");
  }
  iVar5 = scanToken(this,ppToken);
  token = iVar5;
  if (iVar5 == 0x28) {
    token = scanToken(this,ppToken);
  }
  if (token != 0xa2) {
    pTVar12 = this->parseContext;
    pp_Var14 = (pTVar12->super_TParseVersions)._vptr_TParseVersions;
    pcVar8 = "incorrect directive, expected identifier";
    goto LAB_004c958d;
  }
  iVar7 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
  p_Var11 = (this->macroDefs).
            super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  uVar6 = 0;
  if (p_Var11 != (_Base_ptr)0x0) {
    p_Var1 = &(this->macroDefs).
              super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    p_Var9 = &p_Var1->_M_header;
    do {
      if (iVar7 <= (int)p_Var11[1]._M_color) {
        p_Var9 = p_Var11;
      }
      p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < iVar7];
    } while (p_Var11 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var9 != p_Var1) && ((int)p_Var9[1]._M_color <= iVar7)) {
      uVar6 = (uint)(((ulong)p_Var9[3]._M_left & 4) == 0);
    }
  }
  *res = uVar6;
  token = scanToken(this,ppToken);
  if (iVar5 != 0x28) goto LAB_004c9252;
  if (token != 0x29) {
    pTVar12 = this->parseContext;
    pp_Var14 = (pTVar12->super_TParseVersions)._vptr_TParseVersions;
    pcVar8 = "expected \')\'";
LAB_004c958d:
    (*pp_Var14[0x2f])(pTVar12,&local_48,pcVar8,"preprocessor evaluation","");
    *err = true;
    *res = 0;
    return token;
  }
  token = scanToken(this,ppToken);
LAB_004c9252:
  iVar5 = evalToToken(this,token,shortCircuit,res,err,ppToken);
  if (*err == false) {
    while ((iVar5 != 10 && (iVar5 != 0x29))) {
      uVar6 = 0x11;
      while (lVar10 = (ulong)uVar6 * 0x10, *(int *)((anonymous_namespace)::binop + lVar10) != iVar5)
      {
        bVar15 = uVar6 == 0;
        uVar6 = uVar6 - 1;
        if (bVar15) {
          return iVar5;
        }
      }
      iVar7 = *(int *)((anonymous_namespace)::binop + lVar10 + 4);
      if (iVar7 <= precedence) {
        return iVar5;
      }
      iVar2 = *res;
      if (((shortCircuit & 1U) == 0) &&
         ((iVar2 == 1 && iVar5 == 0x8e || (iVar5 == 0x8d && iVar2 == 0)))) {
        shortCircuit = true;
      }
      iVar5 = scanToken(this,ppToken);
      iVar5 = eval(this,iVar5,iVar7,(bool)(shortCircuit & 1),res,err,ppToken);
      pcVar3 = *(code **)((anonymous_namespace)::binop + lVar10 + 8);
      iVar7 = *res;
      if (iVar7 == 0 && (pcVar3 == anon_unknown_6::op_mod || pcVar3 == anon_unknown_6::op_div)) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,&local_48,"division by 0","preprocessor evaluation","");
        *res = 1;
        iVar7 = 1;
      }
      iVar7 = (*pcVar3)(iVar2,iVar7);
      *res = iVar7;
      if (*err == true) {
        return iVar5;
      }
    }
  }
  return iVar5;
LAB_004c9158:
  iVar5 = scanToken(this,ppToken);
  token = eval(this,iVar5,0,shortCircuit,res,err,ppToken);
  if (*err == false) {
    if (token != 0x29) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,&local_48,"expected \')\'","preprocessor evaluation","");
      *err = true;
      goto LAB_004c956d;
    }
LAB_004c914c:
    token = scanToken(this,ppToken);
  }
  goto LAB_004c9252;
  while (bVar15 = uVar6 != 0, uVar6 = uVar6 - 1, bVar15) {
LAB_004c91b8:
    if (*(int *)((anonymous_namespace)::unop + (ulong)uVar6 * 0x10) == token) {
      iVar5 = scanToken(this,ppToken);
      token = eval(this,iVar5,0xc,shortCircuit,res,err,ppToken);
      iVar5 = (**(code **)((anonymous_namespace)::unop + (ulong)uVar6 * 0x10 + 8))(*res);
      *res = iVar5;
      goto LAB_004c9252;
    }
  }
  (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
            (this->parseContext,&local_48,"bad expression","preprocessor evaluation","");
  *err = true;
LAB_004c956d:
  *res = 0;
  return token;
}

Assistant:

int TPpContext::eval(int token, int precedence, bool shortCircuit, int& res, bool& err, TPpToken* ppToken)
{
    TSourceLoc loc = ppToken->loc;  // because we sometimes read the newline before reporting the error
    if (token == PpAtomIdentifier) {
        if (strcmp("defined", ppToken->name) == 0) {
            if (! parseContext.isReadingHLSL() && isMacroInput()) {
                if (parseContext.relaxedErrors())
                    parseContext.ppWarn(ppToken->loc, "nonportable when expanded from macros for preprocessor expression",
                        "defined", "");
                else
                    parseContext.ppError(ppToken->loc, "cannot use in preprocessor expression when expanded from macros",
                        "defined", "");
            }
            bool needclose = 0;
            token = scanToken(ppToken);
            if (token == '(') {
                needclose = true;
                token = scanToken(ppToken);
            }
            if (token != PpAtomIdentifier) {
                parseContext.ppError(loc, "incorrect directive, expected identifier", "preprocessor evaluation", "");
                err = true;
                res = 0;

                return token;
            }

            MacroSymbol* macro = lookupMacroDef(atomStrings.getAtom(ppToken->name));
            res = macro != nullptr ? !macro->undef : 0;
            token = scanToken(ppToken);
            if (needclose) {
                if (token != ')') {
                    parseContext.ppError(loc, "expected ')'", "preprocessor evaluation", "");
                    err = true;
                    res = 0;

                    return token;
                }
                token = scanToken(ppToken);
            }
        } else {
            token = tokenPaste(token, *ppToken);
            token = evalToToken(token, shortCircuit, res, err, ppToken);
            return eval(token, precedence, shortCircuit, res, err, ppToken);
        }
    } else if (token == PpAtomConstInt) {
        res = ppToken->ival;
        token = scanToken(ppToken);
    } else if (token == '(') {
        token = scanToken(ppToken);
        token = eval(token, MIN_PRECEDENCE, shortCircuit, res, err, ppToken);
        if (! err) {
            if (token != ')') {
                parseContext.ppError(loc, "expected ')'", "preprocessor evaluation", "");
                err = true;
                res = 0;

                return token;
            }
            token = scanToken(ppToken);
        }
    } else {
        int op = NUM_ELEMENTS(unop) - 1;
        for (; op >= 0; op--) {
            if (unop[op].token == token)
                break;
        }
        if (op >= 0) {
            token = scanToken(ppToken);
            token = eval(token, UNARY, shortCircuit, res, err, ppToken);
            res = unop[op].op(res);
        } else {
            parseContext.ppError(loc, "bad expression", "preprocessor evaluation", "");
            err = true;
            res = 0;

            return token;
        }
    }

    token = evalToToken(token, shortCircuit, res, err, ppToken);

    // Perform evaluation of binary operation, if there is one, otherwise we are done.
    while (! err) {
        if (token == ')' || token == '\n')
            break;
        int op;
        for (op = NUM_ELEMENTS(binop) - 1; op >= 0; op--) {
            if (binop[op].token == token)
                break;
        }
        if (op < 0 || binop[op].precedence <= precedence)
            break;
        int leftSide = res;

        // Setup short-circuiting, needed for ES, unless already in a short circuit.
        // (Once in a short-circuit, can't turn off again, until that whole subexpression is done.
        if (! shortCircuit) {
            if ((token == PpAtomOr  && leftSide == 1) ||
                (token == PpAtomAnd && leftSide == 0))
                shortCircuit = true;
        }

        token = scanToken(ppToken);
        token = eval(token, binop[op].precedence, shortCircuit, res, err, ppToken);

        if (binop[op].op == op_div || binop[op].op == op_mod) {
            if (res == 0) {
                parseContext.ppError(loc, "division by 0", "preprocessor evaluation", "");
                res = 1;
            }
        }
        res = binop[op].op(leftSide, res);
    }

    return token;
}